

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O0

nghttp2_ssize
nghttp2_hd_huff_decode
          (nghttp2_hd_huff_decode_context *ctx,nghttp2_buf *buf,uint8_t *src,size_t srclen,int final
          )

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  nghttp2_huff_decode *pnVar4;
  uint8_t *puVar5;
  uint8_t c;
  nghttp2_huff_decode *t;
  nghttp2_huff_decode node;
  uint8_t *end;
  int final_local;
  size_t srclen_local;
  uint8_t *src_local;
  nghttp2_buf *buf_local;
  nghttp2_hd_huff_decode_context *ctx_local;
  size_t local_8;
  
  t = &node;
  src_local = src;
  while (src_local != src + srclen) {
    puVar5 = src_local + 1;
    bVar1 = *src_local;
    pnVar4 = huff_decode_table[(int)(t->fstate & 0x1ff)] + ((int)(uint)bVar1 >> 4);
    if ((pnVar4->fstate & 0x8000) != 0) {
      uVar2 = pnVar4->sym;
      puVar3 = buf->last;
      buf->last = puVar3 + 1;
      *puVar3 = uVar2;
    }
    t = huff_decode_table[(int)(pnVar4->fstate & 0x1ff)] + (int)(bVar1 & 0xf);
    src_local = puVar5;
    if ((t->fstate & 0x8000) != 0) {
      uVar2 = t->sym;
      puVar5 = buf->last;
      buf->last = puVar5 + 1;
      *puVar5 = uVar2;
    }
  }
  ctx->fstate = t->fstate;
  local_8 = srclen;
  if ((final != 0) && ((ctx->fstate & 0x4000) == 0)) {
    local_8 = 0xfffffffffffffdf5;
  }
  return local_8;
}

Assistant:

nghttp2_ssize nghttp2_hd_huff_decode(nghttp2_hd_huff_decode_context *ctx,
                                     nghttp2_buf *buf, const uint8_t *src,
                                     size_t srclen, int final) {
  const uint8_t *end = src + srclen;
  nghttp2_huff_decode node = {ctx->fstate, 0};
  const nghttp2_huff_decode *t = &node;
  uint8_t c;

  /* We use the decoding algorithm described in
      - http://graphics.ics.uci.edu/pub/Prefix.pdf [!!! NO LONGER VALID !!!]
      - https://ics.uci.edu/~dan/pubs/Prefix.pdf
      - https://github.com/nghttp2/nghttp2/files/15141264/Prefix.pdf */
  for (; src != end;) {
    c = *src++;
    t = &huff_decode_table[t->fstate & 0x1ff][c >> 4];
    if (t->fstate & NGHTTP2_HUFF_SYM) {
      *buf->last++ = t->sym;
    }

    t = &huff_decode_table[t->fstate & 0x1ff][c & 0xf];
    if (t->fstate & NGHTTP2_HUFF_SYM) {
      *buf->last++ = t->sym;
    }
  }

  ctx->fstate = t->fstate;

  if (final && !(ctx->fstate & NGHTTP2_HUFF_ACCEPTED)) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  return (nghttp2_ssize)srclen;
}